

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client_sample.c
# Opt level: O3

void mqtt_client_sample_run(void)

{
  int iVar1;
  MQTT_CLIENT_HANDLE handle;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE xioHandle;
  SOCKETIO_CONFIG config;
  MQTT_CLIENT_OPTIONS local_60;
  char *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  iVar1 = platform_init();
  if (iVar1 != 0) {
    puts("platform_init failed\r");
    return;
  }
  handle = mqtt_client_init(OnRecvCallback,OnOperationComplete,(void *)0x0,OnErrorComplete,
                            (void *)0x0);
  if (handle == (MQTT_CLIENT_HANDLE)0x0) {
    puts("mqtt_client_init failed\r");
  }
  else {
    mqtt_client_set_trace(handle,false,false);
    local_60.willTopic = (char *)0x0;
    local_60.log_trace = false;
    local_60._49_7_ = 0;
    local_60.clientId = "azureiotclient";
    local_60.willMessage = (char *)0x0;
    local_60.username = (char *)0x0;
    local_60.password = (char *)0x0;
    local_60.keepAliveInterval = 10;
    local_60.messageRetain = false;
    local_60.useCleanSession = true;
    local_60.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
    local_18 = 0;
    local_28 = "test.mosquitto.org";
    uStack_20 = 0x75b;
    io_interface_description = socketio_get_interface_description();
    xioHandle = xio_create(io_interface_description,&local_28);
    if (xioHandle == (XIO_HANDLE)0x0) {
      puts("xio_create failed\r");
    }
    else {
      iVar1 = mqtt_client_connect(handle,xioHandle,&local_60);
      if (iVar1 == 0) {
        do {
          mqtt_client_dowork(handle);
        } while (g_continue != '\x01');
      }
      else {
        puts("mqtt_client_connect failed\r");
      }
      xio_close(xioHandle,OnCloseComplete,(void *)0x0);
      do {
        mqtt_client_dowork(handle);
      } while (g_close_complete != '\x01');
      xio_destroy(xioHandle);
    }
    mqtt_client_deinit(handle);
  }
  platform_deinit();
  return;
}

Assistant:

void mqtt_client_sample_run()
{
    if (platform_init() != 0)
    {
        (void)printf("platform_init failed\r\n");
    }
    else
    {
        MQTT_CLIENT_HANDLE mqttHandle = mqtt_client_init(OnRecvCallback, OnOperationComplete, NULL, OnErrorComplete, NULL);
        if (mqttHandle == NULL)
        {
            (void)printf("mqtt_client_init failed\r\n");
        }
        else
        {
            mqtt_client_set_trace(mqttHandle, false, false);

            MQTT_CLIENT_OPTIONS options = { 0 };
            options.clientId = "azureiotclient";
            options.willMessage = NULL;
            options.username = NULL;
            options.password = NULL;
            options.keepAliveInterval = 10;
            options.useCleanSession = true;
            options.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;

            SOCKETIO_CONFIG config = {"test.mosquitto.org", PORT_NUM_UNENCRYPTED, NULL};

            XIO_HANDLE xio = xio_create(socketio_get_interface_description(), &config);
            if (xio == NULL)
            {
                (void)printf("xio_create failed\r\n");
            }
            else
            {
                if (mqtt_client_connect(mqttHandle, xio, &options) != 0)
                {
                    (void)printf("mqtt_client_connect failed\r\n");
                }
                else
                {
                    do
                    {
                        mqtt_client_dowork(mqttHandle);
                    } while (g_continue);
                }
                xio_close(xio, OnCloseComplete, NULL);

                // Wait for the close connection gets called
                do
                {
                    mqtt_client_dowork(mqttHandle);
                } while (g_close_complete);
                xio_destroy(xio);
            }
            mqtt_client_deinit(mqttHandle);
        }
        platform_deinit();
    }
}